

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O3

void __thiscall
TEST_MockComparatorCopierTest_customObjectParameterFailsWhenNotHavingACopierRepository_Test::
testBody(TEST_MockComparatorCopierTest_customObjectParameterFailsWhenNotHavingACopierRepository_Test
         *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UtestShell *test;
  MockFailureReporterInstaller failureReporterInstaller;
  MyTypeForTesting object;
  MockNoWayToCopyCustomTypeFailure expectedFailure;
  MockFailureReporterInstaller local_b9;
  SimpleString local_b8;
  SimpleString local_a8;
  SimpleString local_98;
  undefined **local_88;
  undefined8 *local_80;
  TestFailure local_78;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&local_b9);
  local_88 = &PTR__MyTypeForTesting_002b2490;
  local_80 = (undefined8 *)
             operator_new(8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                          ,0x2e);
  *local_80 = 1;
  SimpleString::SimpleString((SimpleString *)&local_78,"");
  pMVar2 = mock((SimpleString *)&local_78,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_b8,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_b8);
  SimpleString::SimpleString(&local_98,"MyTypeForTesting");
  SimpleString::SimpleString(&local_a8,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))
            ((long *)CONCAT44(extraout_var,iVar1),&local_98,&local_a8,&local_88);
  SimpleString::~SimpleString(&local_a8);
  SimpleString::~SimpleString(&local_98);
  SimpleString::~SimpleString(&local_b8);
  SimpleString::~SimpleString((SimpleString *)&local_78);
  SimpleString::SimpleString((SimpleString *)&local_78,"");
  pMVar2 = mock((SimpleString *)&local_78,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_b8,"function");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_b8);
  SimpleString::SimpleString(&local_98,"MyTypeForTesting");
  SimpleString::SimpleString(&local_a8,"parameterName");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x30))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_98,&local_a8,&local_88);
  SimpleString::~SimpleString(&local_a8);
  SimpleString::~SimpleString(&local_98);
  SimpleString::~SimpleString(&local_b8);
  SimpleString::~SimpleString((SimpleString *)&local_78);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_b8,"MyTypeForTesting");
  MockNoWayToCopyCustomTypeFailure::MockNoWayToCopyCustomTypeFailure
            ((MockNoWayToCopyCustomTypeFailure *)&local_78,test,&local_b8);
  SimpleString::~SimpleString(&local_b8);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
             ,0x67);
  TestFailure::~TestFailure(&local_78);
  local_88 = &PTR__MyTypeForTesting_002b2490;
  operator_delete(local_80,8);
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&local_b9);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customObjectParameterFailsWhenNotHavingACopierRepository)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MyTypeForTesting object(1);
    mock().expectOneCall("function").withOutputParameterOfTypeReturning("MyTypeForTesting", "parameterName", &object);
    mock().actualCall("function").withOutputParameterOfType("MyTypeForTesting", "parameterName", &object);

    MockNoWayToCopyCustomTypeFailure expectedFailure(mockFailureTest(), "MyTypeForTesting");
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}